

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_char_t * cf_strncpy_s(cf_char_t *dst,cf_size_t dstsize,cf_char_t *src,cf_size_t srcmax)

{
  cf_size_t cVar1;
  cf_void_t *pcVar2;
  cf_size_t srcsize;
  cf_size_t srcmax_local;
  cf_char_t *src_local;
  cf_size_t dstsize_local;
  cf_char_t *dst_local;
  
  if ((dst == (cf_char_t *)0x0) || (src == (cf_char_t *)0x0)) {
    dst_local = (cf_char_t *)0x0;
  }
  else {
    cVar1 = cf_strlen(src);
    if (dstsize < cVar1 + 1) {
      dst_local = (cf_char_t *)0x0;
    }
    else {
      pcVar2 = cf_memcpy_s(dst,dstsize,src,cVar1 + 1);
      if (pcVar2 == (cf_void_t *)0x0) {
        dst_local = (cf_char_t *)0x0;
      }
      else {
        dst[cVar1] = '\0';
        dst_local = dst;
      }
    }
  }
  return dst_local;
}

Assistant:

cf_char_t* cf_strncpy_s(cf_char_t* dst, cf_size_t dstsize, const cf_char_t* src, cf_size_t srcmax) {
    cf_size_t srcsize;
    if(!dst || !src) return CF_NULL_PTR;

    srcsize = cf_strlen(src) + 1;
    srcmax = srcmax > srcsize ? srcmax : srcsize;

    if(srcsize > dstsize) return CF_NULL_PTR;
    if(!cf_memcpy_s(dst, dstsize, src, srcsize)) return CF_NULL_PTR;

    dst[srcsize - 1] = '\0';
    return dst;   
}